

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

bool __thiscall
CppJieba::MPSegment::cut
          (MPSegment *this,const_iterator begin,const_iterator end,
          vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *segWordInfos)

{
  bool bVar1;
  char *pcVar2;
  SegmentBase *in_RDI;
  SegmentContext *in_stack_00000010;
  MPSegment *in_stack_00000018;
  const_iterator in_stack_00000020;
  const_iterator in_stack_00000028;
  SegmentContext segContext;
  char *local_138;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  char *local_118;
  char *local_f8;
  allocator local_d1;
  vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *in_stack_ffffffffffffff30
  ;
  SegmentContext *in_stack_ffffffffffffff38;
  MPSegment *in_stack_ffffffffffffff40;
  allocator local_a9;
  string local_a8 [8];
  SegmentContext *in_stack_ffffffffffffff60;
  MPSegment *in_stack_ffffffffffffff68;
  allocator local_81;
  string local_80 [88];
  bool local_1;
  
  bVar1 = SegmentBase::_getInitFlag(in_RDI);
  if (!bVar1) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                  ,0x74,
                  "bool CppJieba::MPSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<TrieNodeInfo> &) const"
                 );
  }
  std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::vector
            ((vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_> *)0x13d0c2);
  bVar1 = _calcDAG(in_stack_00000018,in_stack_00000028,in_stack_00000020,in_stack_00000010);
  if (bVar1) {
    bVar1 = _calcDP(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (bVar1) {
      in_stack_fffffffffffffed7 =
           _cut(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if ((bool)in_stack_fffffffffffffed7) {
        local_1 = true;
      }
      else {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_138 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
          ;
        }
        else {
          local_138 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                              ,0x2f);
          local_138 = local_138 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xffffffffffffff30,"_cut failed.",&local_d1);
        Limonp::Logger::LoggingF(3,local_138,0x86,(string *)&stack0xffffffffffffff30);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        local_1 = false;
      }
    }
    else {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                       ,0x2f);
      if (pcVar2 == (char *)0x0) {
        local_118 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
        ;
      }
      else {
        local_118 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                            ,0x2f);
        local_118 = local_118 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"_calcDP failed.",&local_a9);
      Limonp::Logger::LoggingF(3,local_118,0x80,(string *)local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      local_1 = false;
    }
  }
  else {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp";
    }
    else {
      local_f8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MPSegment.hpp"
                         ,0x2f);
      local_f8 = local_f8 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"_calcDAG failed.",&local_81);
    Limonp::Logger::LoggingF(3,local_f8,0x7a,(string *)local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_1 = false;
  }
  std::vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>::~vector
            ((vector<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  return local_1;
}

Assistant:

bool cut(Unicode::const_iterator begin , Unicode::const_iterator end, vector<TrieNodeInfo>& segWordInfos)const
            {
				assert(_getInitFlag());
                SegmentContext segContext;

                //calc DAG
                if(!_calcDAG(begin, end, segContext))
                {
                    LogError("_calcDAG failed.");
                    return false;
                }

                if(!_calcDP(segContext))
                {
                    LogError("_calcDP failed.");
                    return false;
                }

                if(!_cut(segContext, segWordInfos))
                {
                    LogError("_cut failed.");
                    return false;
                }

                return true;
            }